

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O2

Type * __thiscall
psy::C::TypeCanonicalizer::canonicalize(TypeCanonicalizer *this,Type *ty,Scope *scope)

{
  TypeKind TVar1;
  BasicTypeKind basicTyK;
  DeclarationCategory DVar2;
  TypeDeclarationCategory TVar3;
  TagTypeKind TVar4;
  TagTypeKind TVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypedefDeclarationSymbol *pTVar8;
  FunctionType *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Type *pTVar9;
  Type *pTVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TagDeclarationSymbol *pTVar11;
  undefined4 extraout_var_07;
  Compilation *pCVar12;
  TypeDeclarationSymbol *pTVar13;
  undefined4 extraout_var_09;
  Identifier *pIVar14;
  DeclarationSymbol *pDVar15;
  undefined4 extraout_var_10;
  ostream *poVar16;
  undefined4 extraout_var_11;
  TagType *this_01;
  long lVar17;
  size_type idx;
  size_type idx_00;
  SyntaxToken *__return_storage_ptr__;
  Type *elemTy;
  pointer local_138;
  Type *ty_local;
  Type *parmTy;
  Type *retTy;
  SyntaxToken local_110;
  SyntaxToken local_d8;
  SyntaxToken local_a0;
  SyntaxToken local_68;
  undefined4 extraout_var_01;
  undefined4 extraout_var_08;
  
  ty_local = ty;
  TVar1 = Type::kind(ty);
  switch(TVar1) {
  case Array:
    iVar6 = (*ty->_vptr_Type[3])(ty);
    pTVar9 = ArrayType::elementType((ArrayType *)CONCAT44(extraout_var,iVar6));
    elemTy = pTVar9;
    pTVar10 = canonicalize(this,pTVar9,scope);
    if (pTVar10 == pTVar9) {
      return ty_local;
    }
    ArrayType::resetElementType((ArrayType *)CONCAT44(extraout_var,iVar6),pTVar10);
    break;
  case Basic:
    iVar6 = (*ty->_vptr_Type[5])(ty);
    pTVar9 = (Type *)CONCAT44(extraout_var_05,iVar6);
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    basicTyK = BasicType::kind((BasicType *)pTVar9);
    pTVar10 = &Compilation::canonicalBasicType(pCVar12,basicTyK)->super_Type;
    goto LAB_0030987f;
  case Function:
    iVar6 = (*ty->_vptr_Type[7])(ty);
    this_00 = (FunctionType *)CONCAT44(extraout_var_01,iVar6);
    pTVar9 = FunctionType::returnType(this_00);
    retTy = pTVar9;
    pTVar10 = canonicalize(this,pTVar9,scope);
    if (pTVar10 != pTVar9) {
      FunctionType::setReturnType(this_00,pTVar10);
      std::__detail::
      _Insert_base<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->discardedTys_,&retTy);
    }
    FunctionType::parameterTypes
              ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&elemTy,
               this_00);
    lVar17 = (long)local_138 - (long)elemTy;
    for (idx_00 = 0; lVar17 >> 3 != idx_00; idx_00 = idx_00 + 1) {
      parmTy = (Type *)(&elemTy->_vptr_Type)[idx_00];
      pTVar9 = canonicalize(this,parmTy,scope);
      if (pTVar9 != parmTy) {
        FunctionType::setParameterType(this_00,idx_00,pTVar9);
        std::__detail::
        _Insert_base<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->discardedTys_,&parmTy);
      }
    }
    std::_Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::~_Vector_base
              ((_Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&elemTy)
    ;
    return ty_local;
  case Pointer:
    iVar6 = (*ty->_vptr_Type[9])(ty);
    pTVar9 = PointerType::referencedType((PointerType *)CONCAT44(extraout_var_02,iVar6));
    elemTy = pTVar9;
    pTVar10 = canonicalize(this,pTVar9,scope);
    if (pTVar10 == pTVar9) {
      return ty_local;
    }
    PointerType::resetReferencedType((PointerType *)CONCAT44(extraout_var_02,iVar6),pTVar10);
    break;
  case TypedefName:
    iVar6 = (*ty->_vptr_Type[0xb])(ty);
    pTVar9 = (Type *)CONCAT44(extraout_var_00,iVar6);
    pTVar8 = TypedefNameType::declaration((TypedefNameType *)pTVar9);
    if (pTVar8 != (TypedefDeclarationSymbol *)0x0) {
      pTVar8 = TypedefNameType::declaration((TypedefNameType *)pTVar9);
      pTVar9 = &TypedefDeclarationSymbol::introducedSynonymType(pTVar8)->super_Type;
      return pTVar9;
    }
    pIVar14 = TypedefNameType::typedefName((TypedefNameType *)pTVar9);
    pDVar15 = Scope::searchForDeclaration(scope,pIVar14,OrdinaryIdentifiers);
    if (pDVar15 == (DeclarationSymbol *)0x0) {
      __return_storage_ptr__ = &local_a0;
      C::SyntaxNode::lastToken(__return_storage_ptr__,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::TypeDeclarationNotFound(&this->diagReporter_,__return_storage_ptr__);
    }
    else {
      DVar2 = DeclarationSymbol::category(pDVar15);
      if (DVar2 == Type) {
        iVar6 = (*(pDVar15->super_Symbol)._vptr_Symbol[0x17])(pDVar15);
        pTVar13 = (TypeDeclarationSymbol *)CONCAT44(extraout_var_08,iVar6);
        TVar3 = TypeDeclarationSymbol::category(pTVar13);
        if (TVar3 == Typedef) {
          iVar6 = (*(pTVar13->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x23])(pTVar13);
          pTVar10 = &TypedefDeclarationSymbol::introducedSynonymType
                               ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_09,iVar6))->
                     super_Type;
          if (pTVar10 != pTVar9) {
            elemTy = pTVar9;
            std::__detail::
            _Insert<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&this->discardedTys_,&elemTy);
            pTVar9 = &TypedefDeclarationSymbol::introducedSynonymType
                                ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_09,iVar6))->
                      super_Type;
            return pTVar9;
          }
          poVar16 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar16 = std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                   );
          poVar16 = std::operator<<(poVar16,":");
          iVar6 = 0xf4;
        }
        else {
          poVar16 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar16 = std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                   );
          poVar16 = std::operator<<(poVar16,":");
          iVar6 = 0xf2;
        }
        goto LAB_00309bd5;
      }
      __return_storage_ptr__ = &local_68;
      C::SyntaxNode::lastToken(__return_storage_ptr__,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::ExpectedTypedefDeclaration(&this->diagReporter_,__return_storage_ptr__);
    }
    goto LAB_00309a54;
  case Tag:
    iVar6 = (*ty->_vptr_Type[0xd])(ty);
    pTVar9 = (Type *)CONCAT44(extraout_var_06,iVar6);
    pTVar11 = TagType::declaration((TagType *)pTVar9);
    if (pTVar11 != (TagDeclarationSymbol *)0x0) {
      pTVar11 = TagType::declaration((TagType *)pTVar9);
      pTVar9 = &TagDeclarationSymbol::introducedNewType(pTVar11)->super_Type;
      return pTVar9;
    }
    pIVar14 = TagType::tag((TagType *)pTVar9);
    pDVar15 = Scope::searchForDeclaration(scope,pIVar14,Tags);
    if (pDVar15 != (DeclarationSymbol *)0x0) {
      DVar2 = DeclarationSymbol::category(pDVar15);
      if (DVar2 == Type) {
        iVar6 = (*(pDVar15->super_Symbol)._vptr_Symbol[0x17])(pDVar15);
        pTVar13 = (TypeDeclarationSymbol *)CONCAT44(extraout_var_10,iVar6);
        TVar3 = TypeDeclarationSymbol::category(pTVar13);
        if (TVar3 == Tag) {
          iVar6 = (*(pTVar13->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x19])(pTVar13);
          pTVar11 = (TagDeclarationSymbol *)CONCAT44(extraout_var_11,iVar6);
          pTVar10 = &TagDeclarationSymbol::introducedNewType(pTVar11)->super_Type;
          if (pTVar10 != pTVar9) {
            TVar4 = TagType::kind((TagType *)pTVar9);
            this_01 = TagDeclarationSymbol::introducedNewType(pTVar11);
            TVar5 = TagType::kind(this_01);
            if (TVar4 == TVar5) {
              elemTy = pTVar9;
              std::__detail::
              _Insert<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((_Insert<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&this->discardedTys_,&elemTy);
              pTVar9 = &TagDeclarationSymbol::introducedNewType(pTVar11)->super_Type;
              pTVar9 = canonicalize(this,pTVar9,scope);
              return pTVar9;
            }
            __return_storage_ptr__ = &local_d8;
            C::SyntaxNode::lastToken(__return_storage_ptr__,&this->tySpecNode_->super_SyntaxNode);
            DiagnosticsReporter::TagTypeDoesNotMatchTagDeclaration
                      (&this->diagReporter_,__return_storage_ptr__);
            goto LAB_00309a54;
          }
          poVar16 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar16 = std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                   );
          poVar16 = std::operator<<(poVar16,":");
          iVar6 = 0x111;
        }
        else {
          poVar16 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar16 = std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                   );
          poVar16 = std::operator<<(poVar16,":");
          iVar6 = 0x10f;
        }
      }
      else {
        poVar16 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar16 = std::operator<<(poVar16,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                 );
        poVar16 = std::operator<<(poVar16,":");
        iVar6 = 0x10d;
      }
LAB_00309bd5:
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,iVar6);
      poVar16 = std::operator<<(poVar16," ");
      poVar16 = std::operator<<(poVar16,"<empty message>");
      std::endl<char,std::char_traits<char>>(poVar16);
      return ty;
    }
    __return_storage_ptr__ = &local_110;
    C::SyntaxNode::lastToken(__return_storage_ptr__,&this->tySpecNode_->super_SyntaxNode);
    DiagnosticsReporter::TypeDeclarationNotFound(&this->diagReporter_,__return_storage_ptr__);
LAB_00309a54:
    SyntaxToken::~SyntaxToken(__return_storage_ptr__);
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    pTVar9 = &Compilation::canonicalErrorType(pCVar12)->super_Type;
    return pTVar9;
  case Void:
    iVar6 = (*ty->_vptr_Type[0xf])(ty);
    pTVar9 = (Type *)CONCAT44(extraout_var_07,iVar6);
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    pTVar10 = &Compilation::canonicalVoidType(pCVar12)->super_Type;
LAB_0030987f:
    if (pTVar10 == pTVar9) {
      return ty_local;
    }
    std::__detail::
    _Insert_base<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->discardedTys_,&ty_local);
    return pTVar10;
  case Qualified:
    iVar6 = (*ty->_vptr_Type[0x11])(ty);
    pTVar9 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar6));
    elemTy = pTVar9;
    pTVar10 = canonicalize(this,pTVar9,scope);
    if (pTVar10 == pTVar9) {
      return ty_local;
    }
    TVar1 = Type::kind(pTVar10);
    if (TVar1 == Qualified) {
      iVar7 = (*pTVar10->_vptr_Type[0x11])(pTVar10);
      pTVar10 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_04,iVar7));
    }
    QualifiedType::resetUnqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar6),pTVar10);
    break;
  default:
    goto switchD_003095f7_default;
  }
  std::__detail::
  _Insert_base<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<const_psy::C::Type_*,_const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>,_std::__detail::_Identity,_std::equal_to<const_psy::C::Type_*>,_std::hash<const_psy::C::Type_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->discardedTys_,&elemTy);
switchD_003095f7_default:
  return ty_local;
}

Assistant:

const Type* TypeCanonicalizer::canonicalize(const Type* ty, const Scope* scope)
{
    switch (ty->kind()) {
        case TypeKind::Array: {
            auto arrTy = ty->asArrayType();
            auto elemTy = arrTy->elementType();
            auto canonTy = canonicalize(elemTy, scope);
            if (canonTy != elemTy) {
                arrTy->resetElementType(canonTy);
                discardedTys_.insert(elemTy);
            }
            break;
        }

        case TypeKind::Basic: {
            auto basicTy = ty->asBasicType();
            auto canonTy =
                semaModel_->compilation()->canonicalBasicType(basicTy->kind());
            if (canonTy != basicTy) {
                discardedTys_.insert(ty);
                return canonTy;
            }
            break;
        }

        case TypeKind::Void: {
            auto voidTy = ty->asVoidType();
            auto canonTy = semaModel_->compilation()->canonicalVoidType();
            if (canonTy != voidTy) {
                discardedTys_.insert(ty);
                return canonTy;
            }
            break;
        }

        case TypeKind::Function: {
            auto funcTy = ty->asFunctionType();
            auto retTy = funcTy->returnType();
            auto canonTy = canonicalize(retTy, scope);
            if (canonTy != retTy) {
                funcTy->setReturnType(canonTy);
                discardedTys_.insert(retTy);
            }
            const auto parms = funcTy->parameterTypes();
            const auto parmsSize = parms.size();
            for (FunctionType::ParameterTypes::size_type idx = 0; idx < parmsSize; ++idx) {
                const Type* parmTy = parms[idx];
                canonTy = canonicalize(parmTy, scope);
                if (canonTy != parmTy) {
                    funcTy->setParameterType(idx, canonTy);
                    discardedTys_.insert(parmTy);
                }
            }
            break;
        }

        case TypeKind::Pointer: {
            auto ptrTy = ty->asPointerType();
            auto refedTy = ptrTy->referencedType();
            auto canonTy = canonicalize(refedTy, scope);
            if (canonTy != refedTy) {
                ptrTy->resetReferencedType(canonTy);
                discardedTys_.insert(refedTy);
            }
            break;
        }

        case TypeKind::TypedefName: {
            auto tydefNameTy = ty->asTypedefNameType();
            if (tydefNameTy->declaration())
                return tydefNameTy->declaration()->introducedSynonymType();
            auto tydefName = tydefNameTy->typedefName();
            auto decl = scope->searchForDeclaration(
                        tydefName,
                        NameSpace::OrdinaryIdentifiers);
            if (decl) {
                if (decl->category() == DeclarationCategory::Type) {
                    auto tyDecl = decl->asTypeDeclaration();
                    // A type declaration found under the ordinary identifiers
                    // namespace must be that of a typedef.
                    PSY_ASSERT_2(tyDecl->category() == TypeDeclarationCategory::Typedef, return ty);
                    auto tydef = tyDecl->asTypedefDeclaration();
                    PSY_ASSERT_2(tydef->introducedSynonymType() != tydefNameTy, return ty);
                    discardedTys_.insert(tydefNameTy);
                    return tydef->introducedSynonymType();
                }
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.ExpectedTypedefDeclaration(tySpecNode_->lastToken());
            }
            else {
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TypeDeclarationNotFound(tySpecNode_->lastToken());
            }
            return semaModel_->compilation()->canonicalErrorType();
        }

        case TypeKind::Tag: {
            auto tagTy = ty->asTagType();
            if (tagTy->declaration())
                return tagTy->declaration()->introducedNewType();
            auto tag = tagTy->tag();
            auto decl = scope->searchForDeclaration(
                        tag,
                        NameSpace::Tags);
            if (decl) {
                // A declaration found under the tags name space must be that
                // of a tag type declaration.
                PSY_ASSERT_2(decl->category() == DeclarationCategory::Type, return ty);
                auto tyDecl = decl->asTypeDeclaration();
                PSY_ASSERT_2(tyDecl->category() == TypeDeclarationCategory::Tag, return ty);
                auto tagDecl = tyDecl->asTagTypeDeclaration();
                PSY_ASSERT_2(tagDecl->introducedNewType() != tagTy, return ty);
                if (tagTy->kind() == tagDecl->introducedNewType()->kind()) {
                    discardedTys_.insert(tagTy);
                    return canonicalize(tagDecl->introducedNewType(), scope);
                }
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TagTypeDoesNotMatchTagDeclaration(tySpecNode_->lastToken());
            } else {
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TypeDeclarationNotFound(tySpecNode_->lastToken());
            }
            return semaModel_->compilation()->canonicalErrorType();
        }

        case TypeKind::Qualified: {
            auto qualTy = ty->asQualifiedType();
            auto unqualTy = qualTy->unqualifiedType();
            auto canonTy = canonicalize(unqualTy, scope);
            if (canonTy != unqualTy) {
                qualTy->resetUnqualifiedType(
                        canonTy->kind() == TypeKind::Qualified
                            ? canonTy->asQualifiedType()->unqualifiedType()
                            : canonTy);
                discardedTys_.insert(unqualTy);
            }
            break;
        }

        case TypeKind::Error:
            break;
    }

    return ty;
}